

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O0

void __thiscall QNetworkReplyHttpImpl::ignoreSslErrors(QNetworkReplyHttpImpl *this)

{
  QNetworkReplyHttpImplPrivate *pQVar1;
  long in_FS_OFFSET;
  QUrl *in_stack_00000010;
  QHstsCache *in_stack_00000018;
  QNetworkReplyHttpImplPrivate *d;
  bool local_22;
  QUrl local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = d_func((QNetworkReplyHttpImpl *)0x315f9a);
  local_22 = false;
  if ((pQVar1->managerPrivate->stsEnabled & 1U) != 0) {
    QNetworkReply::url((QNetworkReply *)&pQVar1->managerPrivate->stsCache);
    local_22 = QHstsCache::isKnownHost(in_stack_00000018,in_stack_00000010);
    QUrl::~QUrl(&local_10);
  }
  if (local_22 == false) {
    pQVar1->pendingIgnoreAllSslErrors = true;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyHttpImpl::ignoreSslErrors()
{
    Q_D(QNetworkReplyHttpImpl);
    Q_ASSERT(d->managerPrivate);

    if (d->managerPrivate->stsEnabled && d->managerPrivate->stsCache.isKnownHost(url())) {
        // We cannot ignore any Security Transport-related errors for this host.
        return;
    }

    d->pendingIgnoreAllSslErrors = true;
}